

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Driver.c
# Opt level: O1

Vec_Int_t * Llb_DriverCountRefs(Aig_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  ulong uVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  
  iVar1 = p->vObjs->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 2);
  lVar6 = (long)p->nRegs;
  if (0 < lVar6) {
    pVVar3 = p->vCos;
    uVar2 = p->nTruePos;
    uVar8 = (ulong)uVar2;
    do {
      if (((int)uVar2 < 0) || (pVVar3->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar4 = *(ulong *)((long)pVVar3->pArray[uVar8] + 8);
      if (uVar4 == 0) {
        uVar9 = 0xffffffff;
      }
      else {
        uVar9 = *(uint *)((uVar4 & 0xfffffffffffffffe) + 0x24);
      }
      if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      __s[uVar9] = __s[uVar9] + 1;
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return pVVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

// driver issue:arises when creating
// - driver ref-counter array
// - Ns2Glo maps
// - final partition
// - change-phase cube

// LI variable is used when
// - driver drives more than one LI
// - driver is a PI
// - driver is a constant

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of times each flop driver is referenced.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Llb_DriverCountRefs( Aig_Man_t * p )
{
    Vec_Int_t * vCounts;
    Aig_Obj_t * pObj;
    int i;
    vCounts = Vec_IntStart( Aig_ManObjNumMax(p) );
    Saig_ManForEachLi( p, pObj, i )
        Vec_IntAddToEntry( vCounts, Aig_ObjFaninId0(pObj), 1 );
    return vCounts;
}